

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O3

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::Write
          (SerializationCloner<Js::StreamWriter> *this,BYTE *bytes,uint32 len)

{
  undefined8 in_RAX;
  ulong uVar1;
  undefined8 local_28;
  uint32 len_local;
  uint32 padding;
  
  local_28 = CONCAT44((int)((ulong)in_RAX >> 0x20),len);
  StreamWriter::Write<unsigned_int>(this->m_writer,(uint *)&local_28);
  StreamWriter::Write(this->m_writer,bytes,local_28 & 0xffffffff);
  uVar1 = local_28 & 3;
  if ((local_28 & 3) != 0) {
    local_28 = local_28 & 0xffffffff;
    StreamWriter::Write(this->m_writer,(void *)((long)&local_28 + 4),4 - uVar1);
  }
  return;
}

Assistant:

void SerializationCloner<Writer>::Write(const BYTE* bytes, uint32 len) const
    {
        m_writer->Write(len);
        m_writer->Write(bytes, len);
        uint32 unalignedLen = len % sizeof(uint32);
        if (unalignedLen)
        {
            uint32 padding = 0;
            m_writer->Write(&padding, sizeof(uint32) - unalignedLen);
        }
    }